

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_util_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::EncodingUtilTest_TestDecodeNegativePrices_Test::TestBody
          (EncodingUtilTest_TestDecodeNegativePrices_Test *this)

{
  bool bVar1;
  double unaff_RBX;
  char *pcVar2;
  double unaff_R14;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  AssertHelper in_stack_ffffffffffffffd0;
  char local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x17fccde60,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.data_,(char *)in_stack_ffffffffffffffc8.ptr_,
             (char *)0x1b097d,unaff_R14,unaff_RBX,(double)in_stack_ffffffffffffffe0.ptr_);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffc8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (in_stack_ffffffffffffffc8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffc8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x26612260,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.data_,(char *)in_stack_ffffffffffffffc8.ptr_,
             (char *)0x1b0a46,unaff_R14,unaff_RBX,(double)in_stack_ffffffffffffffe0.ptr_);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffc8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (in_stack_ffffffffffffffc8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffc8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-6410000000,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.data_,(char *)in_stack_ffffffffffffffc8.ptr_,
             (char *)0x1b0b0f,unaff_R14,unaff_RBX,(double)in_stack_ffffffffffffffe0.ptr_);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffc8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (in_stack_ffffffffffffffc8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffc8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-6499999999,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.data_,(char *)in_stack_ffffffffffffffc8.ptr_,
             (char *)0x1b0bd4,unaff_R14,unaff_RBX,(double)in_stack_ffffffffffffffe0.ptr_);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffc8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (in_stack_ffffffffffffffc8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffc8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x17d784001,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.data_,(char *)in_stack_ffffffffffffffc8.ptr_,
             (char *)0x1b0ca0,unaff_R14,unaff_RBX,(double)in_stack_ffffffffffffffe0.ptr_);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffc8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (in_stack_ffffffffffffffc8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffc8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x8ae03f0,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.data_,(char *)in_stack_ffffffffffffffc8.ptr_,
             (char *)0x1b0d69,unaff_R14,unaff_RBX,(double)in_stack_ffffffffffffffe0.ptr_);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffe0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffc8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (in_stack_ffffffffffffffc8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffc8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffe0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(EncodingUtilTest, TestDecodeNegativePrices)
{
    int32_t scale = 8;
    EXPECT_NEAR(-64.391, EncodingUtil::DecodeDecimal(-6439100000L, scale), DELTA);
    EXPECT_NEAR(-6.439, EncodingUtil::DecodeDecimal(-643900000L, scale), DELTA);
    EXPECT_NEAR(-64.1, EncodingUtil::DecodeDecimal(-6410000000L, scale), DELTA);
    EXPECT_NEAR(-64.99999999, EncodingUtil::DecodeDecimal(-6499999999L, scale), DELTA);
    EXPECT_NEAR(-64.00000001, EncodingUtil::DecodeDecimal(-6400000001L, scale), DELTA);
    EXPECT_NEAR(-1.45622, EncodingUtil::DecodeDecimal(-145622000L, scale), DELTA);
}